

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCompileOptionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddCompileOptionsCommand::Clone(cmAddCompileOptionsCommand *this)

{
  cmCommand *this_00;
  cmAddCompileOptionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddCompileOptionsCommand((cmAddCompileOptionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddCompileOptionsCommand; }